

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mt19937_64 *R)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *P;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  long in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  ignore_spaces_cl *in_stack_fffffffffffff5c8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffff5f0;
  undefined1 local_9e0 [2488];
  status_type *in_stack_ffffffffffffffd8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  mt19937_64::status_type::status_type((status_type *)local_9e0);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = in_RDI + *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  utility::ignore_spaces();
  utility::operator>>(this,in_stack_fffffffffffff5c8);
  utility::delim('\0');
  P = utility::operator>>(this,(delim_c *)in_stack_fffffffffffff5c8);
  mt19937_64::name();
  utility::delim((char *)in_stack_fffffffffffff5c8);
  in_00 = utility::operator>>(in_stack_fffffffffffff5f0,(delim_str *)P);
  utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_fffffffffffff5c8);
  operator>>(in_00,(parameter_type *)P);
  utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_fffffffffffff5c8);
  operator>>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_fffffffffffff5c8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if (bVar1) {
    memcpy((void *)(in_RSI + 8),local_9e0,0x9c8);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mt19937_64 &R) {
      mt19937_64::parameter_type P_new;
      mt19937_64::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mt19937_64::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }